

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O1

void pinger_write_ping(pinger_t *pinger)

{
  int iVar1;
  void *pvVar2;
  undefined8 *extraout_RDX;
  undefined8 uVar3;
  anon_union_264_2_629321f6_for_stream *__size;
  char *unaff_R14;
  long lVar4;
  undefined1 auVar5 [16];
  code *pcStack_80;
  undefined1 local_78 [5] [16];
  
  if (pinger->vectored_writes == 0) {
    pcStack_80 = (code *)0x164ac2;
    local_78[0] = uv_buf_init(PING,5);
    uVar3 = 1;
  }
  else {
    unaff_R14 = PING;
    lVar4 = 8;
    do {
      pcStack_80 = (code *)0x164a94;
      auVar5 = uv_buf_init(unaff_R14,1);
      *(long *)(local_78[-1] + lVar4 + 8) = auVar5._0_8_;
      *(long *)(local_78[0] + lVar4) = auVar5._8_8_;
      unaff_R14 = unaff_R14 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x58);
    uVar3 = 5;
  }
  pcStack_80 = (code *)0x164ada;
  pvVar2 = malloc(0xc0);
  __size = &pinger->stream;
  pcStack_80 = (code *)0x164af5;
  iVar1 = uv_write(pvVar2,__size,local_78,uVar3,pinger_after_write);
  if (iVar1 == 0) {
    pcStack_80 = (code *)0x164b05;
    puts("PING");
    return;
  }
  pcStack_80 = alloc_cb;
  pinger_write_ping_cold_1();
  pcStack_80 = (code *)unaff_R14;
  pvVar2 = malloc((size_t)__size);
  *extraout_RDX = pvVar2;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void pinger_write_ping(pinger_t* pinger) {
  uv_write_t *req;
  uv_buf_t bufs[sizeof PING - 1];
  int i, nbufs;

  if (!pinger->vectored_writes) {
    /* Write a single buffer. */
    nbufs = 1;
    bufs[0] = uv_buf_init(PING, sizeof PING - 1);
  } else {
    /* Write multiple buffers, each with one byte in them. */
    nbufs = sizeof PING - 1;
    for (i = 0; i < nbufs; i++) {
      bufs[i] = uv_buf_init(&PING[i], 1);
    }
  }

  req = malloc(sizeof(*req));
  if (uv_write(req,
               (uv_stream_t*) &pinger->stream.tcp,
               bufs,
               nbufs,
               pinger_after_write)) {
    FATAL("uv_write failed");
  }

  puts("PING");
}